

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildDouble2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar3;
  Instr *local_48;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *srcOpnd;
  RegSlot srcRegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Float);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_01->super_Opnd,ValueType::Float);
  local_48 = (Instr *)0x0;
  if (newOpcode == Ld_Db) {
    local_48 = IR::Instr::New(Ld_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Return_Db) {
    local_48 = IR::Instr::New(Ld_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
    CheckJitLoopReturn(this,dstRegSlot,TyFloat64);
  }
  else if (newOpcode == Neg_Db) {
    local_48 = IR::Instr::New(Neg_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Sin_Db) {
    local_48 = IR::Instr::New(InlineMathSin,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Cos_Db) {
    local_48 = IR::Instr::New(InlineMathCos,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Tan_Db) {
    local_48 = IR::Instr::New(InlineMathTan,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Asin_Db) {
    local_48 = IR::Instr::New(InlineMathAsin,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == Acos_Db) {
    local_48 = IR::Instr::New(InlineMathAcos,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == Atan_Db) {
    local_48 = IR::Instr::New(InlineMathAtan,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == Abs_Db) {
    local_48 = IR::Instr::New(InlineMathAbs,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Ceil_Db) {
    local_48 = IR::Instr::New(InlineMathCeil,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == Floor_Db) {
    local_48 = IR::Instr::New(InlineMathFloor,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func
                             );
  }
  else if (newOpcode == Exp_Db) {
    local_48 = IR::Instr::New(InlineMathExp,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Log_Db) {
    local_48 = IR::Instr::New(InlineMathLog,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Sqrt_Db) {
    local_48 = IR::Instr::New(InlineMathSqrt,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == Trunc_Db) {
    local_48 = IR::Instr::New(Trunc_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else if (newOpcode == Nearest_Db) {
    local_48 = IR::Instr::New(Nearest_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xac5,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AddInstr(this,local_48,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildDouble2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat64);
    srcOpnd->SetValueType(ValueType::Float);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
    dstOpnd->SetValueType(ValueType::Float);

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Ld_Db:
        instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Neg_Db:
        instr = IR::Instr::New(Js::OpCode::Neg_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Sin_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathSin, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Cos_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathCos, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Tan_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathTan, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Asin_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAsin, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Acos_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAcos, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Atan_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAtan, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Abs_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAbs, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Ceil_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathCeil, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Floor_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathFloor, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Exp_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathExp, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Log_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathLog, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Sqrt_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathSqrt, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Return_Db:
        instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyFloat64);
        break;
    case Js::OpCodeAsmJs::Trunc_Db:
        instr = IR::Instr::New(Js::OpCode::Trunc_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Nearest_Db:
        instr = IR::Instr::New(Js::OpCode::Nearest_A, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}